

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_list.hpp
# Opt level: O3

torrent * __thiscall
libtorrent::aux::torrent_list<libtorrent::aux::torrent>::find_obfuscated
          (torrent_list<libtorrent::aux::torrent> *this,sha1_hash *ih)

{
  ulong __code;
  __node_base_ptr p_Var1;
  torrent *ptVar2;
  
  __code = *(ulong *)(ih->m_number)._M_elems;
  ptVar2 = (torrent *)0x0;
  p_Var1 = ::std::
           _Hashtable<libtorrent::digest32<160L>,_std::pair<const_libtorrent::digest32<160L>,_libtorrent::aux::torrent_*>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::aux::torrent_*>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::digest32<160L>_>,_std::hash<libtorrent::digest32<160L>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&(this->m_obfuscated_index)._M_h,
                      __code % (this->m_obfuscated_index)._M_h._M_bucket_count,ih,__code);
  if (p_Var1 != (__node_base_ptr)0x0) {
    if (p_Var1->_M_nxt == (_Hash_node_base *)0x0) {
      ptVar2 = (torrent *)0x0;
    }
    else {
      ptVar2 = (torrent *)p_Var1->_M_nxt[4]._M_nxt;
    }
  }
  return ptVar2;
}

Assistant:

T* find_obfuscated(sha1_hash const& ih)
	{
		auto const i = m_obfuscated_index.find(ih);
		if (i == m_obfuscated_index.end()) return nullptr;
		return i->second;
	}